

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O1

void __thiscall
Object_SingleNumber_Test<wchar_t>::~Object_SingleNumber_Test
          (Object_SingleNumber_Test<wchar_t> *this)

{
  (this->super_Object<wchar_t>).super_Test._vptr_Test = (_func_int **)&PTR__Object_001f2a98;
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)&(this->super_Object<wchar_t>).out);
  std::ios_base::~ios_base((ios_base *)&(this->super_Object<wchar_t>).field_0x80);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x188);
  return;
}

Assistant:

TYPED_TEST (Object, SingleNumber) {
    using namespace ::pstore::dump;
    object v{object::container{{"key", make_number (42)}}};
    v.write (this->out);
    auto const & actual = this->out.str ();
    EXPECT_THAT (split_tokens (actual),
                 ::testing::ElementsAre (convert<TypeParam> ("key"), convert<TypeParam> (":"),
                                         convert<TypeParam> ("0x2a")));
}